

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pTextureCases.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::Texture2DRenderCase::Texture2DRenderCase
          (Texture2DRenderCase *this,Context *context,char *name,char *description,
          deUint32 internalFormat,deUint32 wrapS,deUint32 wrapT,deUint32 minFilter,
          deUint32 magFilter,Mat3 *coordTransform,int numTextures,bool powerOfTwo)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  bool powerOfTwo_local;
  deUint32 wrapS_local;
  deUint32 internalFormat_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  Texture2DRenderCase *this_local;
  
  testCtx = gles3::Context::getTestContext(context);
  renderCtx = gles3::Context::getRenderContext(context);
  deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
            (&this->super_ShaderPerformanceCase,testCtx,renderCtx,name,description,CASETYPE_FRAGMENT
            );
  (this->super_ShaderPerformanceCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Texture2DRenderCase_032ba090;
  this->m_internalFormat = internalFormat;
  this->m_wrapS = wrapS;
  this->m_wrapT = wrapT;
  this->m_minFilter = minFilter;
  this->m_magFilter = magFilter;
  tcu::Matrix<float,_3,_3>::Matrix(&this->m_coordTransform,coordTransform);
  this->m_numTextures = numTextures;
  this->m_powerOfTwo = powerOfTwo;
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::vector(&this->m_textures);
  return;
}

Assistant:

Texture2DRenderCase::Texture2DRenderCase (Context&			context,
										  const char*		name,
										  const char*		description,
										  deUint32			internalFormat,
										  deUint32			wrapS,
										  deUint32			wrapT,
										  deUint32			minFilter,
										  deUint32			magFilter,
										  const tcu::Mat3&	coordTransform,
										  int				numTextures,
										  bool				powerOfTwo)
	: ShaderPerformanceCase	(context.getTestContext(), context.getRenderContext(), name, description, CASETYPE_FRAGMENT)
	, m_internalFormat		(internalFormat)
	, m_wrapS				(wrapS)
	, m_wrapT				(wrapT)
	, m_minFilter			(minFilter)
	, m_magFilter			(magFilter)
	, m_coordTransform		(coordTransform)
	, m_numTextures			(numTextures)
	, m_powerOfTwo			(powerOfTwo)
{
}